

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode compatibleValueRankArrayDimensions(UA_Int32 valueRank,size_t arrayDimensionsSize)

{
  switch(valueRank) {
  case 0:
    if (arrayDimensionsSize == 0) {
      return 0x80740000;
    }
    break;
  case -3:
    if (1 < arrayDimensionsSize) {
      return 0x80740000;
    }
    break;
  case -2:
    break;
  case -1:
    if (arrayDimensionsSize != 0) {
      return 0x80740000;
    }
    break;
  default:
    if ((uint)valueRank != arrayDimensionsSize || valueRank < 0) {
      return 0x80740000;
    }
  }
  return 0;
}

Assistant:

static UA_StatusCode
compatibleValueRankArrayDimensions(UA_Int32 valueRank, size_t arrayDimensionsSize) {
    switch(valueRank) {
    case -3: /* the value can be a scalar or a one dimensional array */
        if(arrayDimensionsSize > 1)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    case -2: /* the value can be a scalar or an array with any number of dimensions */
        break;
    case -1: /* the value is a scalar */
        if(arrayDimensionsSize > 0)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    case 0: /* the value is an array with one or more dimensions */
        if(arrayDimensionsSize < 1)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    default: /* >= 1: the value is an array with the specified number of dimensions */
        if(valueRank < 0)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        /* Must hold if the array has a defined length. Null arrays (length -1)
         * need to be caught before. */
        if(arrayDimensionsSize != (size_t)valueRank)
            return UA_STATUSCODE_BADTYPEMISMATCH;
    }
    return UA_STATUSCODE_GOOD;
}